

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

BCPos bcemit_jmp(FuncState *fs)

{
  BCPos BVar1;
  uint *puVar2;
  BCPos *in_RDI;
  BCIns *ip;
  BCPos j;
  BCPos jpc;
  uint local_10;
  BCPos l2;
  
  l2 = in_RDI[0xc];
  BVar1 = in_RDI[10];
  local_10 = BVar1 - 1;
  puVar2 = (uint *)(*(long *)(in_RDI + 0x12) + (ulong)local_10 * 8);
  in_RDI[0xc] = 0xffffffff;
  if (((int)local_10 < (int)in_RDI[0xb]) || ((*puVar2 & 0xff) != 0x30)) {
    local_10 = bcemit_INS((FuncState *)ip,(BCIns)((ulong)in_RDI >> 0x20));
  }
  else {
    *(undefined2 *)((long)puVar2 + 2) = 0x7fff;
    in_RDI[0xb] = BVar1;
  }
  jmp_append((FuncState *)ip,in_RDI,l2);
  return local_10;
}

Assistant:

static BCPos bcemit_jmp(FuncState *fs)
{
  BCPos jpc = fs->jpc;
  BCPos j = fs->pc - 1;
  BCIns *ip = &fs->bcbase[j].ins;
  fs->jpc = NO_JMP;
  if ((int32_t)j >= (int32_t)fs->lasttarget && bc_op(*ip) == BC_UCLO) {
    setbc_j(ip, NO_JMP);
    fs->lasttarget = j+1;
  } else {
    j = bcemit_AJ(fs, BC_JMP, fs->freereg, NO_JMP);
  }
  jmp_append(fs, &j, jpc);
  return j;
}